

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

N_Vector N_VNew_MultiFab(sunindextype length,BoxArray *ba,DistributionMapping *dm,sunindextype nComp
                        ,sunindextype nGhost)

{
  MultiFab *pMVar1;
  MultiFab **ppMVar2;
  int in_ECX;
  element_type *in_RDX;
  MFInfo *in_RSI;
  int in_EDI;
  int in_R8D;
  MultiFab *mf_v;
  N_Vector v;
  DefaultFabFactory<amrex::FArrayBox> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  BoxArray *bxs;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff84;
  FabFactory<amrex::FArrayBox> *factory;
  BoxArray local_68;
  
  local_68.m_bat.m_op._52_8_ = 0;
  local_68.m_bat.m_op.m_bndryReg.m_doihi.vect[1] = in_R8D;
  local_68.m_bat.m_op.m_bndryReg.m_doihi.vect[2] = in_ECX;
  local_68.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDX;
  local_68.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI;
  local_68.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
  _4_4_ = in_EDI;
  local_68.m_bat.m_op._52_8_ =
       N_VNewEmpty_MultiFab((sunindextype)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if ((N_Vector)local_68.m_bat.m_op._52_8_ == (N_Vector)0x0) {
    local_68.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (0 < local_68.m_simplified_list.
            super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_) {
      pMVar1 = (MultiFab *)operator_new(0x180);
      uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff80);
      local_68.m_bat.m_op._12_8_ = 0;
      local_68.m_bat.m_op._20_8_ = 0;
      local_68.m_bat._0_8_ = 0;
      local_68.m_bat.m_op._4_8_ = 0;
      local_68.m_bat.m_op._28_8_ = 0;
      bxs = &local_68;
      amrex::MFInfo::MFInfo((MFInfo *)0x27b6c8);
      factory = (FabFactory<amrex::FArrayBox> *)0x0;
      amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory(in_stack_ffffffffffffff40);
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_ffffffffffffff84,uVar3),bxs,
                 (DistributionMapping *)
                 CONCAT44(local_68.m_bat.m_op.m_bndryReg.m_doihi.vect[1],
                          local_68.m_bat.m_op.m_bndryReg.m_doihi.vect[2]),
                 (int)((ulong)local_68.m_ref.
                              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr >>
                      0x20),
                 (int)local_68.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,
                 (MFInfo *)
                 local_68.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,factory);
      amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x27b71e);
      amrex::MFInfo::~MFInfo((MFInfo *)0x27b728);
      local_68.m_bat.m_op._44_8_ = pMVar1;
      N_VSetOwnMF_MultiFab((N_Vector)local_68.m_bat.m_op._52_8_,1);
      ppMVar2 = amrex::sundials::getMFptr((N_Vector)local_68.m_bat.m_op._52_8_);
      *ppMVar2 = (MultiFab *)local_68.m_bat.m_op._44_8_;
    }
    local_68.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.m_bat.m_op._52_8_;
  }
  return (N_Vector)
         local_68.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
}

Assistant:

N_Vector N_VNew_MultiFab(sunindextype length,
                            const amrex::BoxArray &ba,
                            const amrex::DistributionMapping &dm,
                            sunindextype nComp,
                            sunindextype nGhost)
{
    N_Vector v;

    v = NULL;
    v = N_VNewEmpty_MultiFab(length);
    if (v == NULL) return(NULL);

    // Create and attach new MultiFab
    if (length > 0)
    {
         amrex::MultiFab *mf_v = new amrex::MultiFab(ba, dm, nComp, nGhost);
         amrex::sundials::N_VSetOwnMF_MultiFab(v, SUNTRUE);
         amrex::sundials::getMFptr(v)     = mf_v;
    }

    return(v);
}